

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O2

size_t remove_trailing_zeroes(char *str)

{
  char cVar1;
  ulong uVar2;
  ushort **ppuVar3;
  size_t sVar4;
  char *__s;
  char *pcVar5;
  long lVar6;
  size_t sVar7;
  
  uVar2 = (ulong)(*str == '-');
  if (str[uVar2 + 3] == '.') {
    lVar6 = -3 - (long)(str + uVar2);
    __s = str + uVar2 + 4;
    sVar7 = 1;
    pcVar5 = (char *)0x0;
    while( true ) {
      cVar1 = *__s;
      if (((long)cVar1 == 0) ||
         (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x10) == 0))
      break;
      if (cVar1 != '0') {
        pcVar5 = __s;
      }
      __s = __s + 1;
      lVar6 = lVar6 + -1;
      sVar7 = sVar7 + 1;
    }
    if (pcVar5 == (char *)0x0) {
      sVar4 = strlen(__s);
      memmove(str + uVar2 + 3,__s,sVar4 + 1);
      return sVar7;
    }
    if (__s != pcVar5 + 1) {
      sVar4 = strlen(__s);
      memmove(pcVar5 + 1,__s,sVar4 + 1);
      return -(long)(pcVar5 + lVar6);
    }
  }
  return 0;
}

Assistant:

static size_t remove_trailing_zeroes(char* str)
{
    // [-]0xh.hhhh00000000p±d -> [-]0xh.hhhhp±d
    // [-]0xh.00000000p±d -> [-]0xh±d
    if (*str == '-') { ++str; }
    assert(*str == '0'); { ++str; }
    assert(*str == 'x'); { ++str; }
    assert(isxdigit(*str)); { ++str; }
    size_t removed = 0;
    if(*str == '.')
    {
        char* point = str;
        { ++str; }
        char* last_non_0 = NULL;
        for(; *str && isxdigit(*str); ++str)
        {
            if(*str != '0')
                last_non_0 = str;
        }
        assert(*str == 'p');
        if(last_non_0)
        {
            if(last_non_0 + 1 != str) {
                removed = str - (last_non_0 + 1);
                memmove(last_non_0 + 1, str, strlen(str)+1);
            }
        }
        else
        {
            memmove(point, str, strlen(str)+1);
            removed = str - point;
        }
    }
    else {
        assert(*str == 'p');
    }
    return removed;
}